

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  Extension *pEVar2;
  MessageLite *this_00;
  Nonnull<const_char_*> pcVar3;
  undefined1 *v1;
  Arena *arena;
  ExtensionSet *const_this;
  undefined1 auStack_38 [16];
  
  v1 = auStack_38;
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar2->is_repeated == false) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    ReleaseMessage();
    goto LAB_001d52af;
  }
  if ((byte)(pEVar2->type - 0x13) < 0xee) {
    ReleaseMessage((ExtensionSet *)auStack_38);
LAB_001d528e:
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1,10,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE"
                       );
  }
  else {
    v1 = (undefined1 *)
         (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4);
    if (v1 != (undefined1 *)0xa) goto LAB_001d528e;
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    pAVar1 = this->arena_;
    if ((pEVar2->field_0xa & 4) == 0) {
      this_00 = (MessageLite *)(pEVar2->field_0).int64_t_value;
      if (pAVar1 != (Arena *)0x0) {
        this_00 = MessageLite::New(this_00,(Arena *)0x0);
        MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)pEVar2->field_0);
      }
    }
    else {
      this_00 = (MessageLite *)
                (**(code **)(**(long **)&(pEVar2->field_0).int32_t_value + 0x40))
                          (*(long **)&(pEVar2->field_0).int32_t_value,prototype,pAVar1);
      if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0)) {
        (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
      }
    }
    Erase(this,number);
    return this_00;
  }
LAB_001d52af:
  ReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}